

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O2

void __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::initialize
          (InputParameter<0UL,_ruckig::StandardVector> *this)

{
  size_t dof;
  ulong __n;
  reference rVar1;
  
  for (__n = 0; __n < this->degrees_of_freedom; __n = __n + 1) {
    (this->current_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = 0.0;
    (this->current_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = 0.0;
    (this->target_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = 0.0;
    (this->target_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = 0.0;
    (this->max_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = INFINITY;
    (this->max_jerk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = INFINITY;
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->enabled,__n);
    *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
  }
  return;
}

Assistant:

void initialize() {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            current_velocity[dof] = 0.0;
            current_acceleration[dof] = 0.0;
            target_velocity[dof] = 0.0;
            target_acceleration[dof] = 0.0;
            max_acceleration[dof] = std::numeric_limits<double>::infinity();
            max_jerk[dof] = std::numeric_limits<double>::infinity();
            enabled[dof] = true;
        }
    }